

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecmanager.cxx
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
vigra::CodecManager::queryCodecBandNumbers
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,CodecManager *this,
          string *filetype)

{
  const_iterator cVar1;
  CodecDesc local_b0;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vigra::CodecFactory_*>_>_>
          ::find(&(this->factoryMap)._M_t,filetype);
  throw_precondition_error
            ((_Rb_tree_header *)cVar1._M_node !=
             &(this->factoryMap)._M_t._M_impl.super__Rb_tree_header,
             "the codec that was queried for its pixeltype does not exist",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/codecmanager.cxx"
             ,0x8e);
  (**(code **)**(undefined8 **)(cVar1._M_node + 2))(&local_b0);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_b0.bandNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_b0.bandNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b0.bandNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b0.bandNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_b0.bandNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_b0.bandNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  CodecDesc::~CodecDesc(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
    CodecManager::queryCodecBandNumbers( const std::string & filetype ) const
    {
        std::map< std::string, CodecFactory * >::const_iterator result
            = factoryMap.find( filetype );
        vigra_precondition( result != factoryMap.end(),
        "the codec that was queried for its pixeltype does not exist" );

        return result->second->getCodecDesc().bandNumbers;
    }